

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O0

Gia_Man_t * Gia_PolynCoreDetectTest(Gia_Man_t *pGia,int fAddExtra,int fAddCones,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *local_38;
  Gia_Man_t *pNew;
  Vec_Int_t *vAddCos;
  int fVerbose_local;
  int fAddCones_local;
  int fAddExtra_local;
  Gia_Man_t *pGia_local;
  
  if (fAddExtra == 0) {
    local_38 = Vec_IntAlloc(0);
  }
  else {
    local_38 = Gia_PolynAddHaRoots(pGia);
  }
  pGVar3 = Gia_PolynCoreDetectTest_int(pGia,local_38,fAddCones,fVerbose);
  uVar1 = Gia_ManCoNum(pGia);
  uVar2 = Vec_IntSize(local_38);
  printf("On top of %d COs, created %d new adder outputs.\n",(ulong)uVar1,(ulong)uVar2);
  Vec_IntFree(local_38);
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_PolynCoreDetectTest( Gia_Man_t * pGia, int fAddExtra, int fAddCones, int fVerbose )
{
    Vec_Int_t * vAddCos = fAddExtra ? Gia_PolynAddHaRoots( pGia ) : Vec_IntAlloc(0);
    Gia_Man_t * pNew = Gia_PolynCoreDetectTest_int( pGia, vAddCos, fAddCones, fVerbose );
    printf( "On top of %d COs, created %d new adder outputs.\n", Gia_ManCoNum(pGia), Vec_IntSize(vAddCos) );
    Vec_IntFree( vAddCos );
    return pNew;
}